

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::SparseBufferTestUtilities::getSparseBOFlagsString_abi_cxx11_
          (string *__return_storage_ptr__,SparseBufferTestUtilities *this,GLenum flags)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream local_1a0 [8];
  stringstream result_sstream;
  ostream local_190;
  int local_18;
  uint local_14;
  uint n_flags_added;
  GLenum flags_local;
  
  local_14 = (uint)this;
  local_18 = 0;
  _n_flags_added = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if ((local_14 & 0x200) != 0) {
    std::operator<<(&local_190,"GL_CLIENT_STORAGE_BIT");
    local_18 = local_18 + 1;
  }
  if ((local_14 & 0x100) != 0) {
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = " | ";
    }
    poVar1 = std::operator<<(&local_190,pcVar2);
    std::operator<<(poVar1,"GL_DYNAMIC_STORAGE_BIT");
    local_18 = local_18 + 1;
  }
  if ((local_14 & 0x80) != 0) {
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = " | ";
    }
    poVar1 = std::operator<<(&local_190,pcVar2);
    std::operator<<(poVar1,"GL_MAP_COHERENT_BIT");
    local_18 = local_18 + 1;
  }
  if ((local_14 & 0x40) != 0) {
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = " | ";
    }
    poVar1 = std::operator<<(&local_190,pcVar2);
    std::operator<<(poVar1,"GL_MAP_PERSISTENT_BIT");
    local_18 = local_18 + 1;
  }
  if ((local_14 & 0x400) != 0) {
    pcVar2 = "";
    if (local_18 != 0) {
      pcVar2 = " | ";
    }
    poVar1 = std::operator<<(&local_190,pcVar2);
    std::operator<<(poVar1,"GL_SPARSE_STORAGE_BIT");
    local_18 = local_18 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseBufferTestUtilities::getSparseBOFlagsString(glw::GLenum flags)
{
	unsigned int	  n_flags_added = 0;
	std::stringstream result_sstream;

	if ((flags & GL_CLIENT_STORAGE_BIT) != 0)
	{
		result_sstream << "GL_CLIENT_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_DYNAMIC_STORAGE_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_DYNAMIC_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_COHERENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_COHERENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_PERSISTENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_SPARSE_STORAGE_BIT_ARB) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_SPARSE_STORAGE_BIT";

		++n_flags_added;
	}

	return result_sstream.str();
}